

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_yuv_rgb.c
# Opt level: O3

int readPPM(char *filename,uint32_t *width,uint32_t *height,uint8_t **RGB)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 in_RAX;
  FILE *__stream;
  size_t sVar3;
  uint8_t *__ptr;
  int iVar4;
  char *__s;
  int iVar5;
  ulong __size;
  char magic [3];
  uint32_t max;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    perror("Error opening rgb image for read");
    return 1;
  }
  sVar3 = fread((void *)((long)&uStack_38 + 1),1,2,__stream);
  uVar1 = uStack_38;
  uStack_38._0_4_ = (uint)(uint3)uStack_38;
  if ((sVar3 != 2) || (uStack_38._1_2_ = SUB82(uVar1,1), uStack_38._1_2_ != 0x3650)) {
    perror("Error reading rgb image header, or invalid format");
    fclose(__stream);
    return 3;
  }
  iVar2 = __isoc99_fscanf(__stream," %u %u %u ",width,height,(long)&uStack_38 + 4);
  iVar5 = 3;
  __s = "Error reading rgb image header, or invalid values";
  iVar4 = iVar5;
  if ((iVar2 == 3) && (uStack_38._4_4_ < 0x100)) {
    __size = (ulong)(*width * *height * 3);
    __ptr = (uint8_t *)malloc(__size);
    *RGB = __ptr;
    if (__ptr == (uint8_t *)0x0) {
      iVar4 = 2;
      __s = "Error allocating rgb image memory";
    }
    else {
      sVar3 = fread(__ptr,1,__size,__stream);
      iVar4 = 0;
      if (sVar3 == __size) goto LAB_0010259d;
      __s = "Error reading rgb image";
      iVar4 = iVar5;
    }
  }
  perror(__s);
LAB_0010259d:
  fclose(__stream);
  return iVar4;
}

Assistant:

int readPPM(const char* filename, uint32_t *width, uint32_t *height, uint8_t **RGB)
{
	FILE *fp = fopen(filename, "rb");
	if(!fp)
	{
		perror("Error opening rgb image for read");
		return 1;
	}
	
	char magic[3];
	size_t result = fread(magic, 1, 2, fp);
	magic[2]='\0';
	if(result!=2 || strcmp(magic,"P6")!=0)
	{
		perror("Error reading rgb image header, or invalid format");
		fclose(fp);
		return 3;
	}
	
	uint32_t max;
	result = fscanf(fp, " %u %u %u ", width, height, &max);
	if(result!=3 || max>255)
	{
		perror("Error reading rgb image header, or invalid values");
		fclose(fp);
		return 3;
	}
	
	size_t size = 3*(*width)*(*height);
	*RGB = malloc(size);
	if(!*RGB)
	{
		perror("Error allocating rgb image memory");
		fclose(fp);
		return 2;
	}
	
	result = fread(*RGB, 1, size, fp);
	if(result != size)
	{
		perror("Error reading rgb image");
		fclose(fp);
		return 3;
	}
	
	fclose(fp);
	return 0;
}